

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O3

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxJoint[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  ulong uVar3;
  long lVar4;
  size_t *psVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xb0),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(0xb0),0) | 8;
  }
  psVar2 = (size_t *)operator_new__(uVar3);
  *psVar2 = n;
  if (n != 0) {
    psVar5 = psVar2 + 7;
    lVar4 = n * 0xb0;
    do {
      memset(psVar5 + -4,0,0xa0);
      psVar5[-6] = (size_t)(psVar5 + -4);
      psVar5[-5] = 0;
      psVar5[-2] = (size_t)psVar5;
      *(undefined1 *)psVar5 = 0;
      *(undefined8 *)((long)psVar5 + 0x14) = 0;
      *(undefined8 *)((long)psVar5 + 0x1c) = 0;
      *(undefined8 *)((long)psVar5 + 0x24) = 0;
      *(undefined8 *)((long)psVar5 + 0x2c) = 0;
      *(undefined8 *)((long)psVar5 + 0x34) = 0;
      *(undefined8 *)((long)psVar5 + 0x3c) = 0;
      *(undefined8 *)((long)psVar5 + 0x44) = 0;
      *(undefined8 *)((long)psVar5 + 0x4c) = 0;
      *(undefined8 *)((long)psVar5 + 0x54) = 0;
      *(undefined8 *)((long)psVar5 + 0x5c) = 0;
      *(undefined8 *)((long)psVar5 + 100) = 0;
      *(undefined8 *)((long)psVar5 + 0x6c) = 0;
      *(undefined8 *)((long)psVar5 + 0x74) = 0;
      psVar5 = psVar5 + 0x16;
      lVar4 = lVar4 + -0xb0;
    } while (lVar4 != 0);
  }
  *(size_t **)this = psVar2 + 1;
  return (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }